

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiak.c
# Opt level: O0

void adiak_fini(void)

{
  adiak_value_t local_10;
  adiak_value_t val;
  
  if (measure_adiak_cputime != 0) {
    measure_cputime();
  }
  if (measure_adiak_systime != 0) {
    measure_systime();
  }
  if (measure_adiak_walltime != 0) {
    measure_walltime();
  }
  local_10.v_int = 0;
  adiak_raw_namevalue("fini",4,(char *)0x0,&local_10,&base_int);
  return;
}

Assistant:

void adiak_fini()
{
   adiak_value_t val;
   if (measure_adiak_cputime)
      measure_cputime();
   if (measure_adiak_systime)
      measure_systime();
   if (measure_adiak_walltime)
      measure_walltime();

   val.v_int = 0;
   adiak_raw_namevalue("fini", adiak_control, NULL, &val, &base_int);
}